

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXParser.cpp
# Opt level: O3

aiMatrix4x4 * Assimp::FBX::ReadMatrix(aiMatrix4x4 *__return_storage_ptr__,Element *element)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float __tmp;
  float __tmp_1;
  float __tmp_2;
  float __tmp_3;
  float __tmp_4;
  float __tmp_5;
  vector<float,_std::allocator<float>_> values;
  vector<float,_std::allocator<float>_> local_48;
  string local_30;
  
  local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (float *)0x0;
  local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  ParseVectorDataArray(&local_48,element);
  if ((long)local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start == 0x40) {
    __return_storage_ptr__->a1 =
         *local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start;
    fVar1 = local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start[1];
    fVar2 = local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start[2];
    fVar3 = local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start[3];
    fVar4 = local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start[4];
    __return_storage_ptr__->b2 =
         local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
         _M_start[5];
    fVar5 = local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start[6];
    fVar6 = local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start[7];
    fVar7 = local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start[8];
    fVar8 = local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start[9];
    __return_storage_ptr__->c3 =
         local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
         _M_start[10];
    fVar9 = local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start[0xb];
    fVar10 = local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start[0xc];
    fVar11 = local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start[0xd];
    fVar12 = local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start[0xe];
    __return_storage_ptr__->d4 =
         local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
         _M_start[0xf];
    __return_storage_ptr__->b1 = fVar1;
    __return_storage_ptr__->a2 = fVar4;
    __return_storage_ptr__->c1 = fVar2;
    __return_storage_ptr__->a3 = fVar7;
    __return_storage_ptr__->c2 = fVar5;
    __return_storage_ptr__->b3 = fVar8;
    __return_storage_ptr__->d1 = fVar3;
    __return_storage_ptr__->a4 = fVar10;
    __return_storage_ptr__->d2 = fVar6;
    __return_storage_ptr__->b4 = fVar11;
    __return_storage_ptr__->d3 = fVar9;
    __return_storage_ptr__->c4 = fVar12;
    operator_delete(local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
    return __return_storage_ptr__;
  }
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_30,"expected 16 matrix elements","");
  anon_unknown.dwarf_224f1b::ParseError(&local_30,(Element *)0x0);
}

Assistant:

aiMatrix4x4 ReadMatrix(const Element& element)
{
    std::vector<float> values;
    ParseVectorDataArray(values,element);

    if(values.size() != 16) {
        ParseError("expected 16 matrix elements");
    }

    aiMatrix4x4 result;


    result.a1 = values[0];
    result.a2 = values[1];
    result.a3 = values[2];
    result.a4 = values[3];

    result.b1 = values[4];
    result.b2 = values[5];
    result.b3 = values[6];
    result.b4 = values[7];

    result.c1 = values[8];
    result.c2 = values[9];
    result.c3 = values[10];
    result.c4 = values[11];

    result.d1 = values[12];
    result.d2 = values[13];
    result.d3 = values[14];
    result.d4 = values[15];

    result.Transpose();
    return result;
}